

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
visit_typed_array(typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *this,span<const_unsigned_short,_18446744073709551615UL> *data,
                 semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  allocator_type local_29;
  vector<unsigned_short,std::allocator<unsigned_short>> local_28 [24];
  
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            (local_28,data->data_,data->data_ + data->size_,&local_29);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign(this->v_,local_28);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const value_type>& data,  
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_ = std::vector<value_type>(data.begin(),data.end());
            JSONCONS_VISITOR_RETURN;
        }